

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O2

void phits_close_file(phits_file_t ff)

{
  if (ff.internal != (void *)0x0) {
    if (*ff.internal != 0) {
      mcpl_generic_fclose(ff.internal);
    }
    free(ff.internal);
    return;
  }
  phits_error("Invalid file object passed to phits_close_file");
}

Assistant:

void phits_close_file(phits_file_t ff)
{
  phits_fileinternal_t * f = (phits_fileinternal_t *)ff.internal;
  if (!f)
    phits_error("Invalid file object passed to phits_close_file");
  if ( f->filehandle.internal ) {
    mcpl_generic_fclose( &f->filehandle );
    f->filehandle.internal = NULL;
  }
  free(f);
  ff.internal = 0;
}